

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_inverse_field(secp256k1_fe *out,secp256k1_fe *x,int var)

{
  secp256k1_scalar *a;
  undefined4 extraout_EAX;
  int iVar1;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar2;
  ulong uVar3;
  int extraout_EDX;
  ulong uVar4;
  long *extraout_RDX;
  long lVar5;
  ulong uVar6;
  uint64_t uVar7;
  ulong uVar8;
  secp256k1_fe *r_00;
  long lVar9;
  ulong uVar10;
  secp256k1_fe *r_01;
  secp256k1_fe *psVar11;
  secp256k1_fe *psVar12;
  uchar *__s;
  ulong uVar13;
  ulong uVar14;
  uint64_t uVar15;
  size_t count;
  uint64_t uVar16;
  uint64_t uVar17;
  code *pcVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  secp256k1_fe r;
  ulong uStack_1228;
  secp256k1_fe *psStack_1220;
  uchar auStack_1218 [4232];
  secp256k1_fe *psStack_190;
  ulong uStack_188;
  uint64_t uStack_180;
  secp256k1_fe *psStack_178;
  code *pcStack_170;
  code *pcStack_168;
  undefined1 auStack_160 [36];
  int iStack_13c;
  int iStack_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int iStack_128;
  int iStack_124;
  undefined1 auStack_120 [48];
  code *pcStack_f0;
  long local_e0;
  secp256k1_fe local_d8;
  secp256k1_fe *local_a0;
  secp256k1_fe local_98;
  secp256k1_fe local_68;
  
  local_a0 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (var == 0) {
    local_a0 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_f0 = (code *)0x14bfa9;
  (*(code *)local_a0)(&local_d8);
  if (out != (secp256k1_fe *)0x0) {
    out->n[4] = local_d8.n[4];
    out->magnitude = local_d8.magnitude;
    out->normalized = local_d8.normalized;
    out->n[2] = local_d8.n[2];
    out->n[3] = local_d8.n[3];
    out->n[0] = local_d8.n[0];
    out->n[1] = local_d8.n[1];
  }
  uVar17 = 0xfffffffffffff;
  uVar15 = 0xf000000000000;
  uVar6 = 0xffffffffffff;
  uVar14 = 0x1000003d0;
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  psVar11 = &local_68;
  pcStack_f0 = (code *)0x14c020;
  secp256k1_fe_verify(psVar11);
  local_e0 = 0x1000003d1;
  uVar3 = (local_68.n[4] >> 0x30) * 0x1000003d1 + local_68.n[0];
  if (((uVar3 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar3 & 0xfffffffffffff) == 0)) {
    uVar4 = (uVar3 >> 0x34) + local_68.n[1];
    uVar8 = (uVar4 >> 0x34) + local_68.n[2];
    uVar10 = (uVar8 >> 0x34) + local_68.n[3];
    uVar13 = (uVar10 >> 0x34) + (local_68.n[4] & 0xffffffffffff);
    if ((((uVar4 | uVar3 | uVar8 | uVar10) & 0xfffffffffffff) != 0 || uVar13 != 0) &&
       (((uVar3 | 0x1000003d0) & uVar4 & uVar8 & uVar10 & (uVar13 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c0c3;
LAB_0014c4d7:
    x = &local_d8;
    pcStack_f0 = (code *)0x14c4e4;
    secp256k1_fe_verify(x);
    uVar6 = uVar6 & local_d8.n[4];
    uVar3 = (local_d8.n[4] >> 0x30) * local_e0 + local_d8.n[0];
    uVar4 = (uVar3 >> 0x34) + local_d8.n[1];
    uVar8 = (uVar4 >> 0x34) + local_d8.n[2];
    r_00 = (secp256k1_fe *)((uVar8 >> 0x34) + local_d8.n[3]);
    uVar10 = ((ulong)r_00 >> 0x34) + uVar6;
    if ((((uVar4 | uVar3 | uVar8 | (ulong)r_00) & uVar17) == 0 && uVar10 == 0) ||
       (r_01 = (secp256k1_fe *)(uVar10 ^ uVar15),
       ((uVar3 ^ uVar14) & uVar4 & uVar8 & (ulong)r_00 & (ulong)r_01) == uVar17)) {
      return;
    }
  }
  else {
LAB_0014c0c3:
    pcStack_f0 = (code *)0x14c0db;
    r_00 = x;
    secp256k1_fe_mul(&local_68,x,&local_d8);
    pcStack_f0 = (code *)0x14c0e3;
    secp256k1_fe_verify(&local_68);
    r_01 = &fe_minus_one;
    pcStack_f0 = (code *)0x14c0ef;
    secp256k1_fe_verify(&fe_minus_one);
    if (local_68.magnitude < 0x20) {
      local_68.n[0] = local_68.n[0] + 0xffffefffffc2e;
      local_68.n[1] = local_68.n[1] + 0xfffffffffffff;
      local_68.n[2] = local_68.n[2] + 0xfffffffffffff;
      local_68.n[3] = local_68.n[3] + 0xfffffffffffff;
      local_68.n[4] = local_68.n[4] + 0xffffffffffff;
      local_68.normalized = 0;
      local_68.magnitude = local_68.magnitude + 1;
      pcStack_f0 = (code *)0x14c144;
      secp256k1_fe_verify(&local_68);
      pcStack_f0 = (code *)0x14c14c;
      secp256k1_fe_verify(&local_68);
      uVar3 = (local_68.n[4] >> 0x30) * local_e0 + local_68.n[0];
      uVar6 = (uVar3 >> 0x34) + local_68.n[1];
      uVar4 = (uVar6 >> 0x34) + local_68.n[2];
      r_00 = (secp256k1_fe *)((uVar4 >> 0x34) + local_68.n[3]);
      uVar8 = ((ulong)r_00 >> 0x34) + (local_68.n[4] & 0xffffffffffff);
      if ((((uVar6 | uVar3 | uVar4 | (ulong)r_00) & 0xfffffffffffff) != 0 || uVar8 != 0) &&
         (r_01 = (secp256k1_fe *)(uVar8 ^ 0xf000000000000),
         ((uVar3 ^ 0x1000003d0) & uVar6 & uVar4 & (ulong)r_00 & (ulong)r_01) != 0xfffffffffffff))
      goto LAB_0014c565;
      local_98.n[0] = x->n[0];
      local_98.n[1] = x->n[1];
      local_98.n[2] = x->n[2];
      local_98.n[3] = x->n[3];
      local_98.n[4] = x->n[4];
      local_98.magnitude = x->magnitude;
      local_98.normalized = x->normalized;
      x = &local_98;
      pcStack_f0 = (code *)0x14c1e4;
      secp256k1_fe_verify(x);
      r_01 = &fe_minus_one;
      pcStack_f0 = (code *)0x14c1f0;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < local_98.magnitude) goto LAB_0014c56a;
      uVar7 = local_98.n[0] + 0xffffefffffc2e;
      uVar16 = local_98.n[1] + 0xfffffffffffff;
      uVar17 = local_98.n[2] + 0xfffffffffffff;
      uVar15 = local_98.n[3] + 0xfffffffffffff;
      uVar14 = local_98.n[4] + 0xffffffffffff;
      local_98.normalized = 0;
      local_98.magnitude = local_98.magnitude + 1;
      pcStack_f0 = (code *)0x14c265;
      local_98.n[0] = uVar7;
      local_98.n[1] = uVar16;
      local_98.n[2] = uVar17;
      local_98.n[3] = uVar15;
      local_98.n[4] = uVar14;
      secp256k1_fe_verify(&local_98);
      pcStack_f0 = (code *)0x14c26d;
      secp256k1_fe_verify(&local_98);
      psVar11 = local_a0;
      uVar3 = (uVar14 >> 0x30) * local_e0 + uVar7;
      if (((uVar3 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar3 & 0xfffffffffffff) == 0)) {
        uVar14 = uVar14 & 0xffffffffffff;
        uVar10 = uVar16 + (uVar3 >> 0x34);
        uVar6 = (uVar10 >> 0x34) + uVar17;
        uVar4 = (uVar6 >> 0x34) + uVar15;
        uVar8 = (uVar4 >> 0x34) + uVar14;
        if (((uVar10 | uVar3 | uVar6 | uVar4) & 0xfffffffffffff) == 0 && uVar8 == 0) {
          return;
        }
        if (((uVar3 | 0x1000003d0) & uVar10 & uVar6 & uVar4 & (uVar8 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      r_00 = &local_98;
      pcStack_f0 = (code *)0x14c32d;
      (*(code *)local_a0)();
      x = &local_d8;
      pcStack_f0 = (code *)0x14c33a;
      secp256k1_fe_verify(x);
      r_01 = &fe_minus_one;
      pcStack_f0 = (code *)0x14c346;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < local_d8.magnitude) goto LAB_0014c56f;
      x = &local_d8;
      local_d8.n[0] = local_d8.n[0] + 0xffffefffffc2e;
      local_d8.n[1] = local_d8.n[1] + 0xfffffffffffff;
      local_d8.n[2] = local_d8.n[2] + 0xfffffffffffff;
      local_d8.n[3] = local_d8.n[3] + 0xfffffffffffff;
      local_d8.n[4] = local_d8.n[4] + 0xffffffffffff;
      local_d8.magnitude = local_d8.magnitude + 1;
      uVar6 = 0;
      local_d8.normalized = 0;
      pcStack_f0 = (code *)0x14c38f;
      secp256k1_fe_verify(x);
      pcStack_f0 = (code *)0x14c398;
      r_00 = x;
      (*(code *)psVar11)(x);
      pcStack_f0 = (code *)0x14c3a0;
      secp256k1_fe_verify(x);
      local_d8.n[0] = local_d8.n[0] + 1;
      local_d8.magnitude = local_d8.magnitude + 1;
      local_d8.normalized = 0;
      pcStack_f0 = (code *)0x14c3b1;
      secp256k1_fe_verify(x);
      pcStack_f0 = (code *)0x14c3b9;
      secp256k1_fe_verify(x);
      psVar11 = &local_98;
      pcStack_f0 = (code *)0x14c3c6;
      r_01 = psVar11;
      secp256k1_fe_verify(psVar11);
      if (local_98.magnitude + local_d8.magnitude < 0x21) {
        local_d8.n[0] = local_d8.n[0] + local_98.n[0];
        local_d8.n[1] = local_d8.n[1] + local_98.n[1];
        local_d8.n[2] = local_d8.n[2] + local_98.n[2];
        local_d8.n[3] = local_d8.n[3] + local_98.n[3];
        local_d8.n[4] = local_d8.n[4] + local_98.n[4];
        local_d8.normalized = 0;
        pcStack_f0 = (code *)0x14c414;
        local_d8.magnitude = local_98.magnitude + local_d8.magnitude;
        secp256k1_fe_verify(&local_d8);
        pcStack_f0 = (code *)0x14c41c;
        secp256k1_fe_verify(&local_d8);
        uVar3 = (local_d8.n[4] >> 0x30) * local_e0 + local_d8.n[0];
        if (((uVar3 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar3 & 0xfffffffffffff) == 0)) {
          uVar4 = (uVar3 >> 0x34) + local_d8.n[1];
          uVar8 = (uVar4 >> 0x34) + local_d8.n[2];
          uVar10 = (uVar8 >> 0x34) + local_d8.n[3];
          uVar13 = (uVar10 >> 0x34) + (local_d8.n[4] & 0xffffffffffff);
          if (((uVar4 | uVar3 | uVar8 | uVar10) & 0xfffffffffffff) == 0 && uVar13 == 0) {
            return;
          }
          if (((uVar3 | 0x1000003d0) & uVar4 & uVar8 & uVar10 & (uVar13 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_f0 = (code *)0x14c4d7;
        test_inverse_field_cold_2();
        goto LAB_0014c4d7;
      }
    }
    else {
      pcStack_f0 = (code *)0x14c565;
      test_inverse_field_cold_7();
LAB_0014c565:
      pcStack_f0 = (code *)0x14c56a;
      test_inverse_field_cold_6();
LAB_0014c56a:
      psVar11 = &local_68;
      pcStack_f0 = (code *)0x14c56f;
      test_inverse_field_cold_5();
LAB_0014c56f:
      uVar6 = 0xffffffffffff;
      pcStack_f0 = (code *)0x14c574;
      test_inverse_field_cold_4();
    }
    pcStack_f0 = (code *)0x14c579;
    test_inverse_field_cold_3();
  }
  pcStack_f0 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar12 = (secp256k1_fe *)auStack_160;
  pcVar18 = secp256k1_scalar_inverse_var;
  if (extraout_EDX == 0) {
    pcVar18 = secp256k1_scalar_inverse;
  }
  pcStack_168 = (code *)0x14c5a7;
  auStack_120._32_8_ = x;
  auStack_120._40_8_ = psVar11;
  pcStack_f0 = (code *)uVar17;
  (*pcVar18)(auStack_160);
  if (r_01 != (secp256k1_fe *)0x0) {
    r_01->n[2] = CONCAT44(auStack_160._20_4_,auStack_160._16_4_);
    r_01->n[3] = CONCAT44(auStack_160._28_4_,auStack_160._24_4_);
    r_01->n[0] = CONCAT44(auStack_160._4_4_,auStack_160._0_4_);
    r_01->n[1] = CONCAT44(auStack_160._12_4_,auStack_160._8_4_);
  }
  pcStack_168 = (code *)0x14c5c6;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  auVar19._0_4_ = -(uint)((int)r_00->n[2] == 0 && (int)r_00->n[0] == 0);
  auVar19._4_4_ = -(uint)(*(int *)((long)r_00->n + 0x14) == 0 && *(int *)((long)r_00->n + 4) == 0);
  auVar19._8_4_ = -(uint)((int)r_00->n[3] == 0 && (int)r_00->n[1] == 0);
  auVar19._12_4_ =
       -(uint)(*(int *)((long)r_00->n + 0x1c) == 0 && *(int *)((long)r_00->n + 0xc) == 0);
  iVar1 = movmskps(extraout_EAX,auVar19);
  if (iVar1 != 0xf) {
    r_01 = (secp256k1_fe *)auStack_120;
    pcStack_168 = (code *)0x14c5fa;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_01,(secp256k1_scalar *)r_00,(secp256k1_scalar *)auStack_160);
    pcStack_168 = (code *)0x14c602;
    psVar11 = r_01;
    secp256k1_scalar_verify((secp256k1_scalar *)r_01);
    if (((auStack_120._0_8_ != 1 || auStack_120._8_8_ != 0) || auStack_120._16_8_ != 0) ||
        auStack_120._24_8_ != 0) {
      pcStack_168 = (code *)0x14c70c;
      test_inverse_scalar_cold_1();
      goto LAB_0014c70c;
    }
    pcStack_168 = (code *)0x14c632;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_160 + 0x20),(secp256k1_scalar *)r_00,&scalar_minus_one);
    pcStack_168 = (code *)0x14c63a;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_160 + 0x20));
    auVar20._0_4_ = -(uint)(iStack_130 == 0 && auStack_160._32_4_ == 0);
    auVar20._4_4_ = -(uint)(iStack_12c == 0 && iStack_13c == 0);
    auVar20._8_4_ = -(uint)(iStack_128 == 0 && iStack_138 == 0);
    auVar20._12_4_ = -(uint)(iStack_124 == 0 && iStack_134 == 0);
    iVar1 = movmskps(extraout_EAX_00,auVar20);
    if (iVar1 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_160 + 0x20);
    pcStack_168 = (code *)0x14c66b;
    (*pcVar18)(a,a);
    pcStack_168 = (code *)0x14c680;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_160,&scalar_minus_one,(secp256k1_scalar *)auStack_160);
    pcStack_168 = (code *)0x14c689;
    (*pcVar18)(auStack_160,auStack_160);
    pcStack_168 = (code *)0x14c69b;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_160,(secp256k1_scalar *)auStack_160,&secp256k1_scalar_one
              );
    pcStack_168 = (code *)0x14c6a9;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_160,a,(secp256k1_scalar *)auStack_160);
    pcStack_168 = (code *)0x14c6b1;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_160);
    auVar21._0_4_ = -(uint)(auStack_160._16_4_ == 0 && auStack_160._0_4_ == 0);
    auVar21._4_4_ = -(uint)(auStack_160._20_4_ == 0 && auStack_160._4_4_ == 0);
    auVar21._8_4_ = -(uint)(auStack_160._24_4_ == 0 && auStack_160._8_4_ == 0);
    auVar21._12_4_ = -(uint)(auStack_160._28_4_ == 0 && auStack_160._12_4_ == 0);
    iVar1 = movmskps(extraout_EAX_01,auVar21);
    if (iVar1 == 0xf) {
      return;
    }
    pcStack_168 = (code *)0x14c6d5;
    test_inverse_scalar_cold_2();
    r_01 = (secp256k1_fe *)auStack_160;
  }
  pcStack_168 = (code *)0x14c6e0;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_160);
  auVar22._0_4_ = -(uint)(auStack_160._16_4_ == 0 && auStack_160._0_4_ == 0);
  auVar22._4_4_ = -(uint)(auStack_160._20_4_ == 0 && auStack_160._4_4_ == 0);
  auVar22._8_4_ = -(uint)(auStack_160._24_4_ == 0 && auStack_160._8_4_ == 0);
  auVar22._12_4_ = -(uint)(auStack_160._28_4_ == 0 && auStack_160._12_4_ == 0);
  iVar1 = movmskps(extraout_EAX_02,auVar22);
  r_00 = (secp256k1_fe *)auStack_160;
  psVar11 = psVar12;
  if (iVar1 == 0xf) {
    return;
  }
LAB_0014c70c:
  pcStack_168 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1218;
  psStack_190 = r_00;
  uStack_188 = uVar14;
  uStack_180 = uVar15;
  psStack_178 = r_01;
  pcStack_170 = pcVar18;
  pcStack_168 = (code *)uVar6;
  memset(__s,0,0x1081);
  uStack_1228 = 0;
  lVar9 = 0x41;
  psStack_1220 = psVar11;
  secp256k1_hsort(__s,0x41,(size_t)psVar11,test_hsort_cmp,&uStack_1228);
  if (0x3f < uStack_1228) {
    test_hsort_is_sorted(auStack_1218,0x41,(size_t)psVar11);
    if (0 < COUNT) {
      iVar1 = 0;
      do {
        uVar2 = testrand_int(0x41);
        count = (size_t)(int)uVar2;
        testrand_bytes_test(auStack_1218,count * (long)psVar11);
        secp256k1_hsort(auStack_1218,count,(size_t)psVar11,test_hsort_cmp,&uStack_1228);
        test_hsort_is_sorted(auStack_1218,count,(size_t)psVar11);
        iVar1 = iVar1 + 1;
      } while (iVar1 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX = *extraout_RDX + 1;
  if (extraout_RDX[1] != 0) {
    lVar5 = 0;
    do {
      if (__s[lVar5] != *(uchar *)(lVar9 + lVar5)) {
        return;
      }
      lVar5 = lVar5 + 1;
    } while (extraout_RDX[1] != lVar5);
  }
  return;
}

Assistant:

static void test_inverse_field(secp256k1_fe* out, const secp256k1_fe* x, int var)
{
    secp256k1_fe l, r, t;

    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, x) ;   /* l = 1/x */
    if (out) *out = l;
    t = *x;                                                    /* t = x */
    if (secp256k1_fe_normalizes_to_zero_var(&t)) {
        CHECK(secp256k1_fe_normalizes_to_zero(&l));
        return;
    }
    secp256k1_fe_mul(&t, x, &l);                               /* t = x*(1/x) */
    secp256k1_fe_add(&t, &fe_minus_one);                       /* t = x*(1/x)-1 */
    CHECK(secp256k1_fe_normalizes_to_zero(&t));                /* x*(1/x)-1 == 0 */
    r = *x;                                                    /* r = x */
    secp256k1_fe_add(&r, &fe_minus_one);                       /* r = x-1 */
    if (secp256k1_fe_normalizes_to_zero_var(&r)) return;
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&r, &r);   /* r = 1/(x-1) */
    secp256k1_fe_add(&l, &fe_minus_one);                       /* l = 1/x-1 */
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, &l);   /* l = 1/(1/x-1) */
    secp256k1_fe_add_int(&l, 1);                               /* l = 1/(1/x-1)+1 */
    secp256k1_fe_add(&l, &r);                                  /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_fe_normalizes_to_zero_var(&l));            /* l == 0 */
}